

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

DdNode * GetSingleOutputFunctionRemappedNewDD
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdManager **DdNew)

{
  int nVars;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdManager *ddDestination;
  int local_74;
  int nVarsMax;
  DdNode *aFuncNew;
  DdNode *bFuncNew;
  DdNode *bFunc;
  int local_50;
  int Counter;
  int v;
  int i;
  DdNode *bTemp;
  DdNode *bSupp;
  DdManager *ddnew;
  int nVarsEnc;
  DdManager **DdNew_local;
  int nOuts_local;
  DdNode **pOutputs_local;
  DdManager *dd_local;
  
  local_74 = 0;
  for (Counter = 0; Counter < nOuts; Counter = Counter + 1) {
    pDVar1 = Cudd_Support(dd,pOutputs[Counter]);
    Cudd_Ref(pDVar1);
    bFunc._4_4_ = 0;
    for (_v = pDVar1; _v != dd->one; _v = (_v->type).kids.T) {
      GetSingleOutputFunctionRemappedNewDD::Permute[_v->index] = dd->invperm[bFunc._4_4_];
      bFunc._4_4_ = bFunc._4_4_ + 1;
    }
    pDVar2 = Cudd_bddPermute(dd,pOutputs[Counter],GetSingleOutputFunctionRemappedNewDD::Permute);
    GetSingleOutputFunctionRemappedNewDD::pRemapped[Counter] = pDVar2;
    Cudd_Ref(GetSingleOutputFunctionRemappedNewDD::pRemapped[Counter]);
    Cudd_RecursiveDeref(dd,pDVar1);
    if (local_74 < bFunc._4_4_) {
      local_74 = bFunc._4_4_;
    }
  }
  nVars = Abc_Base2Log(nOuts);
  for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
    pDVar1 = Cudd_bddNewVarAtLevel(dd,local_50);
    GetSingleOutputFunctionRemappedNewDD::pbVarsEnc[local_50] = pDVar1;
  }
  pDVar1 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemappedNewDD::pRemapped,nOuts,
                      GetSingleOutputFunctionRemappedNewDD::pbVarsEnc,nVars);
  Cudd_Ref(pDVar1);
  for (local_50 = 0; local_50 < local_74 + nVars; local_50 = local_50 + 1) {
    GetSingleOutputFunctionRemappedNewDD::Permute[dd->invperm[local_50]] = local_50;
  }
  ddDestination = Cudd_Init(local_74 + nVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pDVar2 = Cudd_bddTransferPermute
                     (dd,ddDestination,pDVar1,GetSingleOutputFunctionRemappedNewDD::Permute);
  Cudd_Ref(pDVar2);
  Cudd_RecursiveDeref(dd,pDVar1);
  for (Counter = 0; Counter < nOuts; Counter = Counter + 1) {
    Cudd_RecursiveDeref(dd,GetSingleOutputFunctionRemappedNewDD::pRemapped[Counter]);
  }
  pDVar1 = Cudd_BddToAdd(ddDestination,pDVar2);
  Cudd_Ref(pDVar1);
  Cudd_RecursiveDeref(ddDestination,pDVar2);
  *DdNew = ddDestination;
  Cudd_Deref(pDVar1);
  return pDVar1;
}

Assistant:

DdNode * GetSingleOutputFunctionRemappedNewDD( DdManager * dd, DdNode ** pOutputs, int nOuts, DdManager ** DdNew )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    static DdNode * pbVarsEnc[MAXINPUTS];
    int nVarsEnc;

    DdManager * ddnew;

    DdNode * bSupp, * bTemp;
    int i, v, Counter;
    DdNode * bFunc;

    // these are in the new manager
    DdNode * bFuncNew;
    DdNode * aFuncNew;

    int nVarsMax = 0;

    // perform the remapping and write the DDs into the new manager
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        // to remap the DD into the upper part of the manager
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = dd->invperm[Counter++];

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );


        // determine the largest support size
        if ( nVarsMax < Counter )
            nVarsMax = Counter;
    }
    
    // select the encoding variables to follow immediately after the original variables
    nVarsEnc = Abc_Base2Log(nOuts);
/*
    for ( v = 0; v < nVarsEnc; v++ )
        if ( nVarsMax + v < dd->size )
            pbVarsEnc[v] = dd->var[ dd->invperm[nVarsMax+v] ];
        else
            pbVarsEnc[v] = Cudd_bddNewVar( dd );
*/
    // create the new variables on top of the manager
    for ( v = 0; v < nVarsEnc; v++ )
        pbVarsEnc[v] = Cudd_bddNewVarAtLevel( dd, v );

//fprintf( pTable, "%d ", Cudd_SharingSize( pRemapped, nOuts ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pRemapped, nOuts) );


    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );


    // find the cross-manager permutation
    // the variable from the level v in the old manager 
    // should become a variable number v in the new manager
    for ( v = 0; v < nVarsMax + nVarsEnc; v++ )
        Permute[dd->invperm[v]] = v;


    ///////////////////////////////////////////////////////////////////////////////
    // start the new manager
    ddnew = Cudd_Init( nVarsMax + nVarsEnc, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0);
//  Cudd_AutodynDisable(ddnew);
    Cudd_AutodynEnable(dd, CUDD_REORDER_SYMM_SIFT);

    // transfer it to the new manager
    bFuncNew = Cudd_bddTransferPermute( dd, ddnew, bFunc, Permute );      Cudd_Ref( bFuncNew );
    ///////////////////////////////////////////////////////////////////////////////


    // deref the intermediate results in the old manager
    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );


    ///////////////////////////////////////////////////////////////////////////////
    // convert to ADD in the new manager
    aFuncNew = Cudd_BddToAdd( ddnew, bFuncNew );  Cudd_Ref( aFuncNew );
    Cudd_RecursiveDeref( ddnew, bFuncNew );

    // return the manager
    *DdNew = ddnew;
    ///////////////////////////////////////////////////////////////////////////////

    Cudd_Deref( aFuncNew );
    return aFuncNew;
}